

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

RtAudioErrorType __thiscall RtApiAlsa::stopStream(RtApiAlsa *this)

{
  RtAudioErrorType RVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_70 [32];
  string local_50 [32];
  snd_pcm_t **local_30;
  snd_pcm_t **handle;
  AlsaHandle *apiInfo;
  RtApiAlsa *pRStack_18;
  int result;
  RtApiAlsa *this_local;
  
  pRStack_18 = this;
  if (((this->super_RtApi).stream_.state != STREAM_RUNNING) &&
     ((this->super_RtApi).stream_.state != STREAM_STOPPING)) {
    if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_RtApi).errorText_,
                 "RtApiAlsa::stopStream(): the stream is already stopped!");
    }
    else if ((this->super_RtApi).stream_.state == STREAM_CLOSED) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_RtApi).errorText_,
                 "RtApiAlsa::stopStream(): the stream is closed!");
    }
    RVar1 = RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return RVar1;
  }
  (this->super_RtApi).stream_.state = STREAM_STOPPED;
  pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
  apiInfo._4_4_ = 0;
  local_30 = (snd_pcm_t **)(this->super_RtApi).stream_.apiHandle;
  handle = local_30;
  if (((this->super_RtApi).stream_.mode == OUTPUT) || ((this->super_RtApi).stream_.mode == DUPLEX))
  {
    if (((ulong)local_30[2] & 1) == 0) {
      apiInfo._4_4_ = snd_pcm_drain(*local_30);
    }
    else {
      apiInfo._4_4_ = snd_pcm_drop(*local_30);
    }
    if (apiInfo._4_4_ < 0) {
      poVar2 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                               "RtApiAlsa::stopStream: error draining output pcm device, ");
      pcVar3 = (char *)snd_strerror(apiInfo._4_4_);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,".");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_50);
      std::__cxx11::string::~string(local_50);
      goto LAB_00122bd9;
    }
  }
  if (((((this->super_RtApi).stream_.mode == INPUT) || ((this->super_RtApi).stream_.mode == DUPLEX))
      && (((ulong)handle[2] & 1) == 0)) &&
     (apiInfo._4_4_ = snd_pcm_drop(local_30[1]), apiInfo._4_4_ < 0)) {
    poVar2 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,
                             "RtApiAlsa::stopStream: error stopping input pcm device, ");
    pcVar3 = (char *)snd_strerror(apiInfo._4_4_);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,".");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,local_70);
    std::__cxx11::string::~string(local_70);
  }
LAB_00122bd9:
  *(undefined1 *)(handle + 9) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
  if (apiInfo._4_4_ < 0) {
    this_local._4_4_ = RtApi::error(&this->super_RtApi,RTAUDIO_SYSTEM_ERROR);
  }
  else {
    this_local._4_4_ = RTAUDIO_NO_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

RtAudioErrorType RtApiAlsa :: stopStream()
{
  if ( stream_.state != STREAM_RUNNING && stream_.state != STREAM_STOPPING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::stopStream(): the stream is closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    if ( apiInfo->synchronized ) 
      result = snd_pcm_drop( handle[0] );
    else
      result = snd_pcm_drain( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error draining output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::stopStream: error stopping input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}